

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O2

void Acb_NtkCleanObjCounts(Acb_Ntk_t *p)

{
  uint nCapMin;
  ulong uVar1;
  ulong uVar2;
  
  nCapMin = (p->vObjType).nCap;
  Vec_FltGrow(&p->vCounts,nCapMin);
  uVar1 = 0;
  uVar2 = 0;
  if (0 < (int)nCapMin) {
    uVar2 = (ulong)nCapMin;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    (p->vCounts).pArray[uVar1] = 0.0;
  }
  (p->vCounts).nSize = nCapMin;
  return;
}

Assistant:

static inline void           Acb_NtkCleanObjCounts( Acb_Ntk_t * p )          { Vec_FltFill(&p->vCounts,   Vec_StrCap(&p->vObjType),  0);                                   }